

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET calc_next_i_ratio(RcModelV2Ctx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RK_S32 local_2c;
  int local_28;
  RK_S32 ratio;
  RK_S32 bits_alloc;
  RK_S32 pre_qp;
  RK_S32 gop_len;
  RK_S32 max_i_prop;
  RcCfg *usr_cfg;
  RcModelV2Ctx *ctx_local;
  
  iVar3 = (ctx->usr_cfg).max_i_bit_prop * 0x10;
  iVar1 = (ctx->usr_cfg).igop;
  iVar2 = ctx->pre_i_qp;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","calc_next_i_ratio",ctx);
  }
  if (iVar1 < 2) {
    local_28 = (int)((ctx->gop_total_bits * (long)iVar3) / (long)iVar3);
  }
  else {
    local_28 = (int)((ctx->gop_total_bits * (long)iVar3) / (long)(iVar3 + (iVar1 + -1) * 0x10));
  }
  if ((local_28 < ctx->pre_real_bits) || (ctx->next_i_ratio != 0)) {
    local_2c = mpp_clip(((ctx->pre_real_bits - local_28) * 0x100) / local_28,-0x100,0x100);
    local_2c = ctx->next_i_ratio + local_2c;
    if (local_2c < 0) {
      local_2c = 0;
    }
    else if (max_i_delta_qp[iVar2] < local_2c) {
      local_2c = max_i_delta_qp[iVar2];
    }
    ctx->next_i_ratio = local_2c;
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","ctx->next_i_ratio %d","calc_next_i_ratio",
                 (ulong)(uint)ctx->next_i_ratio);
    }
  }
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","calc_next_i_ratio",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET calc_next_i_ratio(RcModelV2Ctx *ctx)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 max_i_prop = usr_cfg->max_i_bit_prop * 16;
    RK_S32 gop_len    = usr_cfg->igop;
    RK_S32 pre_qp     = ctx->pre_i_qp;
    RK_S32 bits_alloc;

    rc_dbg_func("enter %p\n", ctx);
    if (gop_len > 1) {
        bits_alloc = ctx->gop_total_bits * max_i_prop / (max_i_prop + 16 * (gop_len - 1));
    } else {
        bits_alloc = ctx->gop_total_bits * max_i_prop / max_i_prop;
    }

    if (ctx->pre_real_bits > bits_alloc || ctx->next_i_ratio) {
        RK_S32 ratio = ((ctx->pre_real_bits - bits_alloc) << 8) / bits_alloc;

        ratio = mpp_clip(ratio, -256, 256);
        ratio = ctx->next_i_ratio + ratio;
        if (ratio >= 0) {
            if (ratio > max_i_delta_qp[pre_qp])
                ratio = max_i_delta_qp[pre_qp];
        } else {
            ratio = 0;
        }
        ctx->next_i_ratio = ratio;
        rc_dbg_rc("ctx->next_i_ratio %d", ctx->next_i_ratio);
    }

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;

}